

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

ssize_t __thiscall JSON::JSON_blob::write(JSON_blob *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  Pipeline *this_00;
  Pl_Base64 base64;
  Pl_Concatenate cat;
  Pl_Base64 PStack_98;
  Pl_Concatenate local_50;
  
  this_00 = (Pipeline *)CONCAT44(in_register_00000034,__fd);
  Pipeline::operator<<(this_00,"\"");
  Pl_Concatenate::Pl_Concatenate(&local_50,"blob concatenate",this_00);
  Pl_Base64::Pl_Base64(&PStack_98,"blob base64",&local_50.super_Pipeline,a_encode);
  std::function<void_(Pipeline_*)>::operator()(&this->fn,&PStack_98.super_Pipeline);
  Pl_Base64::finish(&PStack_98);
  Pipeline::operator<<(this_00,"\"");
  Pipeline::~Pipeline(&PStack_98.super_Pipeline);
  Pl_Concatenate::~Pl_Concatenate(&local_50);
  return extraout_RAX;
}

Assistant:

void
JSON::JSON_blob::write(Pipeline* p, size_t) const
{
    *p << "\"";
    Pl_Concatenate cat("blob concatenate", p);
    Pl_Base64 base64("blob base64", &cat, Pl_Base64::a_encode);
    fn(&base64);
    base64.finish();
    *p << "\"";
}